

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.c
# Opt level: O3

void ignore_end_spaces(char *str)

{
  size_t sVar1;
  byte *pbVar2;
  
  sVar1 = strlen(str);
  pbVar2 = (byte *)(str + sVar1);
  if (0 < (long)sVar1) {
    do {
      if ((0x20 < (ulong)*pbVar2) || ((0x100002601U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0)) break;
      pbVar2 = pbVar2 + -1;
    } while (str < pbVar2);
  }
  if (str <= pbVar2) {
    pbVar2[1] = 0;
  }
  return;
}

Assistant:

static void ignore_end_spaces(char *str) {
  char *end = str + strlen(str);
  while (end > str && (end[0] == ' ' || end[0] == '\t' || end[0] == '\n' ||
                       end[0] == '\r' || end[0] == '\0'))
    --end;
  if (end >= str) end[1] = '\0';
}